

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O1

int __thiscall
cmCTestBuildHandler::RunMakeCommand
          (cmCTestBuildHandler *this,string *command,int *retVal,char *dir,int timeout,ostream *ofs,
          Encoding encoding)

{
  cmCTest *pcVar1;
  bool bVar2;
  cmCTestBuildHandler *pcVar3;
  pointer ppcVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  cmsysProcess *pcVar8;
  ostream *poVar9;
  t_BuildProcessingQueueType *queue;
  long *plVar10;
  unsigned_long uVar11;
  long lVar12;
  char *pcVar13;
  pointer ppcVar14;
  unsigned_long dindex;
  string *arg;
  pointer pbVar15;
  bool bVar16;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  basic_string_view<char,_std::char_traits<char>_> __str;
  cmProcessOutput processOutput;
  size_type tick;
  int length;
  Directory launchDir;
  cmCTestBuildErrorWarning errorwarning;
  string strdata;
  vector<const_char_*,_std::allocator<const_char_*>_> argv;
  char *data;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  LaunchHelper launchHelper;
  ostringstream cmCTestLog_msg;
  cmProcessOutput local_421;
  cmCTestBuildHandler *local_420;
  int *local_418;
  cmsysProcess *local_410;
  ostream *local_408;
  t_BuildProcessingQueueType *local_400;
  size_t local_3f8;
  int local_3ec;
  undefined1 local_3e8 [32];
  undefined1 local_3c8 [8];
  _Alloc_hider local_3c0;
  undefined1 local_3b8 [24];
  _Alloc_hider local_3a0;
  size_type local_398;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_390;
  _Alloc_hider local_380;
  size_type local_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_370;
  int local_360;
  _Alloc_hider local_358;
  size_type local_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  _Alloc_hider local_338;
  size_type local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  string local_318;
  vector<const_char_*,_std::allocator<const_char_*>_> local_2f8;
  t_ErrorsAndWarningsVector *local_2d8;
  char *local_2d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c8;
  string local_2b0;
  string local_290;
  LaunchHelper local_270;
  undefined1 local_260 [8];
  _Alloc_hider local_258;
  undefined1 local_250 [24];
  _Alloc_hider local_238;
  undefined1 local_230 [24];
  _Alloc_hider local_218;
  undefined1 local_210 [24];
  int local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0 [6];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_160 [2];
  cmsysProcess *local_120;
  int local_118;
  string local_f0 [192];
  
  local_420 = this;
  local_418 = retVal;
  local_408 = ofs;
  cmSystemTools::ParseArguments(&local_2c8,command);
  if (local_2c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_2c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    iVar5 = 0;
    goto LAB_0054fb6e;
  }
  local_400 = (t_BuildProcessingQueueType *)CONCAT44(local_400._4_4_,timeout);
  local_2f8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (char **)0x0;
  local_2f8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (char **)0x0;
  local_2f8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_410 = (cmsysProcess *)dir;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve
            (&local_2f8,
             ((long)local_2c8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_2c8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
  if (local_2c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_2c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar15 = local_2c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_260 = (undefined1  [8])(pbVar15->_M_dataplus)._M_p;
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_2f8,(char **)local_260);
      pbVar15 = pbVar15 + 1;
    } while (pbVar15 !=
             local_2c8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_260 = (undefined1  [8])0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_2f8,(char **)local_260);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_260);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_260,"Run command:",0xc);
  pcVar3 = local_420;
  pcVar1 = (local_420->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
               ,0x311,(char *)local_3c8,(pcVar3->super_cmCTestGenericHandler).Quiet);
  if (local_3c8 != (undefined1  [8])local_3b8) {
    operator_delete((void *)local_3c8,local_3b8._0_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_260);
  std::ios_base::~ios_base((ios_base *)local_1f0._M_local_buf);
  ppcVar4 = local_2f8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pcVar3 = local_420;
  if (local_2f8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_2f8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppcVar14 = local_2f8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    do {
      pcVar13 = *ppcVar14;
      if (pcVar13 == (char *)0x0) break;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_260);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_260," \"",2);
      sVar7 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_260,pcVar13,sVar7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_260,"\"",1);
      pcVar1 = (pcVar3->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                   ,0x317,(char *)local_3c8,(pcVar3->super_cmCTestGenericHandler).Quiet);
      if (local_3c8 != (undefined1  [8])local_3b8) {
        operator_delete((void *)local_3c8,local_3b8._0_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_260);
      std::ios_base::~ios_base((ios_base *)local_1f0._M_local_buf);
      ppcVar14 = ppcVar14 + 1;
    } while (ppcVar14 != ppcVar4);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_260);
  std::ios::widen((char)(ostringstream *)local_260 + (char)*(_func_int **)((long)local_260 + -0x18))
  ;
  std::ostream::put((char)local_260);
  std::ostream::flush();
  pcVar3 = local_420;
  pcVar1 = (local_420->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
               ,0x31a,(char *)local_3c8,(pcVar3->super_cmCTestGenericHandler).Quiet);
  if (local_3c8 != (undefined1  [8])local_3b8) {
    operator_delete((void *)local_3c8,local_3b8._0_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_260);
  std::ios_base::~ios_base((ios_base *)local_1f0._M_local_buf);
  LaunchHelper::LaunchHelper(&local_270,local_420);
  pcVar8 = cmsysProcess_New();
  cmsysProcess_SetCommand
            (pcVar8,local_2f8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  cmsysProcess_SetWorkingDirectory(pcVar8,(char *)local_410);
  cmsysProcess_SetOption(pcVar8,0,1);
  cmsysProcess_SetTimeout(pcVar8,(double)(int)local_400);
  cmsysProcess_Execute(pcVar8);
  local_3f8 = 0;
  cmProcessOutput::cmProcessOutput(&local_421,encoding,0x400);
  local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
  local_318._M_string_length = 0;
  local_318.field_2._M_local_buf[0] = '\0';
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_260);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_260,"   Each symbol represents ",0x1a);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)local_260);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," bytes of output.",0x11);
  std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
  std::ostream::put((char)poVar9);
  poVar9 = (ostream *)std::ostream::flush();
  pcVar13 = "   \'!\' represents an error and \'*\' a warning.\n";
  bVar16 = local_420->UseCTestLaunch != false;
  if (bVar16) {
    pcVar13 = "";
  }
  lVar12 = 0x2e;
  if (bVar16) {
    lVar12 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar13,lVar12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"    ",4);
  std::ostream::flush();
  pcVar3 = local_420;
  pcVar1 = (local_420->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
               ,0x338,(char *)local_3c8,(pcVar3->super_cmCTestGenericHandler).Quiet);
  local_410 = pcVar8;
  if (local_3c8 != (undefined1  [8])local_3b8) {
    operator_delete((void *)local_3c8,local_3b8._0_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_260);
  std::ios_base::~ios_base((ios_base *)local_1f0._M_local_buf);
  pcVar3 = local_420;
  local_400 = &local_420->BuildProcessingQueue;
  std::deque<char,_std::allocator<char>_>::clear(local_400);
  pcVar3->OutputLineCounter = 0;
  local_2d8 = &pcVar3->ErrorsAndWarnings;
  std::
  vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
  ::_M_erase_at_end(local_2d8,
                    (pcVar3->ErrorsAndWarnings).
                    super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  pcVar3->TotalErrors = 0;
  pcVar3->TotalWarnings = 0;
  pcVar3->BuildOutputLogSize = 0;
  pcVar3->LastTickChar = '.';
  pcVar3->ErrorQuotaReached = false;
  pcVar3->WarningQuotaReached = false;
  while (iVar5 = cmsysProcess_WaitForData(local_410,&local_2d0,&local_3ec,(double *)0x0), iVar5 != 0
        ) {
    if (0 < local_3ec) {
      lVar12 = 0;
      do {
        if (local_2d0[lVar12] == '\0') {
          local_2d0[lVar12] = '\n';
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < local_3ec);
    }
    if (iVar5 == 3) {
      cmProcessOutput::DecodeText(&local_421,local_2d0,(long)local_3ec,&local_318,1);
      queue = &pcVar3->BuildProcessingErrorQueue;
    }
    else {
      cmProcessOutput::DecodeText(&local_421,local_2d0,(long)local_3ec,&local_318,2);
      queue = local_400;
    }
    ProcessBuffer(local_420,local_318._M_dataplus._M_p,local_318._M_string_length,&local_3f8,0x400,
                  local_408,queue);
  }
  local_290._M_string_length = 0;
  local_290.field_2._M_local_buf[0] = '\0';
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  cmProcessOutput::DecodeText(&local_421,&local_290,&local_318,1);
  pcVar8 = local_410;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,
                    CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                             local_290.field_2._M_local_buf[0]) + 1);
  }
  if (local_318._M_string_length != 0) {
    ProcessBuffer(local_420,local_318._M_dataplus._M_p,local_318._M_string_length,&local_3f8,0x400,
                  local_408,&local_420->BuildProcessingErrorQueue);
  }
  local_2b0._M_string_length = 0;
  local_2b0.field_2._M_local_buf[0] = '\0';
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  cmProcessOutput::DecodeText(&local_421,&local_2b0,&local_318,2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,
                    CONCAT71(local_2b0.field_2._M_allocated_capacity._1_7_,
                             local_2b0.field_2._M_local_buf[0]) + 1);
  }
  if (local_318._M_string_length != 0) {
    ProcessBuffer(local_420,local_318._M_dataplus._M_p,local_318._M_string_length,&local_3f8,0x400,
                  local_408,local_400);
  }
  ProcessBuffer(local_420,(char *)0x0,0,&local_3f8,0x400,local_408,local_400);
  ProcessBuffer(local_420,(char *)0x0,0,&local_3f8,0x400,local_408,
                &local_420->BuildProcessingErrorQueue);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_260);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_260," Size of output: ",0x11);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)local_260);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"K",1);
  std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  pcVar3 = local_420;
  pcVar1 = (local_420->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
               ,0x36e,(char *)local_3c8,(pcVar3->super_cmCTestGenericHandler).Quiet);
  if (local_3c8 != (undefined1  [8])local_3b8) {
    operator_delete((void *)local_3c8,local_3b8._0_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_260);
  std::ios_base::~ios_base((ios_base *)local_1f0._M_local_buf);
  cmsysProcess_WaitForExit(pcVar8,(double *)0x0);
  iVar5 = cmsysProcess_GetState(pcVar8);
  switch(iVar5) {
  case 1:
    local_3c0._M_p = local_3b8 + 8;
    local_3b8._0_8_ = 0;
    local_3b8._8_8_ = local_3b8._8_8_ & 0xffffffffffffff00;
    local_3a0._M_p = (pointer)&local_390;
    local_398 = 0;
    local_390._M_local_buf[0] = '\0';
    local_378 = 0;
    local_370._M_local_buf[0] = '\0';
    local_350 = 0;
    local_348._M_local_buf[0] = '\0';
    local_330 = 0;
    local_328._M_local_buf[0] = '\0';
    local_360 = 0;
    local_3c8._4_4_ = 1;
    local_380._M_p = (pointer)&local_370;
    local_358._M_p = (pointer)&local_348;
    local_338._M_p = (pointer)&local_328;
    pcVar13 = cmsysProcess_GetErrorString(pcVar8);
    local_250._0_8_ = strlen(pcVar13);
    local_260 = (undefined1  [8])0x15;
    local_258._M_p = "*** ERROR executing: ";
    views._M_len = 2;
    views._M_array = (iterator)local_260;
    local_250._8_8_ = pcVar13;
    cmCatViews_abi_cxx11_((string *)local_3e8,views);
    std::__cxx11::string::operator=((string *)&local_3c0,(string *)local_3e8);
    if ((DirectoryInternals *)local_3e8._0_8_ != (DirectoryInternals *)(local_3e8 + 0x10)) {
      operator_delete((void *)local_3e8._0_8_,local_3e8._16_8_ + 1);
    }
    local_350 = 0;
    *local_358._M_p = '\0';
    local_330 = 0;
    *local_338._M_p = '\0';
    local_3c8[0] = 1;
    std::
    vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
    ::emplace_back<cmCTestBuildHandler::cmCTestBuildErrorWarning>
              (local_2d8,(cmCTestBuildErrorWarning *)local_3c8);
    local_420->TotalErrors = local_420->TotalErrors + 1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_260);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_260,"There was an error: ",0x14);
    pcVar13 = cmsysProcess_GetErrorString(local_410);
    if (pcVar13 == (char *)0x0) {
      std::ios::clear((int)(&stack0xfffffffffffffbc8 +
                           (long)*(_func_int **)((long)local_260 + -0x18)) + 0x1d8);
    }
    else {
      sVar7 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_260,pcVar13,sVar7);
    }
    std::ios::widen((char)(ostream *)local_260 + (char)*(_func_int **)((long)local_260 + -0x18));
    std::ostream::put((char)local_260);
    std::ostream::flush();
    pcVar1 = (local_420->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                 ,0x3bf,(char *)local_3e8._0_8_,false);
    if ((DirectoryInternals *)local_3e8._0_8_ != (DirectoryInternals *)(local_3e8 + 0x10)) {
      operator_delete((void *)local_3e8._0_8_,local_3e8._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_260);
    std::ios_base::~ios_base((ios_base *)local_1f0._M_local_buf);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_p != &local_328) {
      operator_delete(local_338._M_p,
                      CONCAT71(local_328._M_allocated_capacity._1_7_,local_328._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_p != &local_348) {
      operator_delete(local_358._M_p,
                      CONCAT71(local_348._M_allocated_capacity._1_7_,local_348._M_local_buf[0]) + 1)
      ;
    }
    pcVar8 = local_410;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_p != &local_370) {
      operator_delete(local_380._M_p,
                      CONCAT71(local_370._M_allocated_capacity._1_7_,local_370._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_p != &local_390) {
      operator_delete(local_3a0._M_p,
                      CONCAT71(local_390._M_allocated_capacity._1_7_,local_390._M_local_buf[0]) + 1)
      ;
    }
    if (local_3c0._M_p != local_3b8 + 8) {
      operator_delete(local_3c0._M_p,(ulong)(local_3b8._8_8_ + 1));
    }
    break;
  case 2:
    if (local_418 != (int *)0x0) {
      iVar6 = cmsysProcess_GetExitException(pcVar8);
      *local_418 = iVar6;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_260);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_260,"There was an exception: ",0x18);
      plVar10 = (long *)std::ostream::operator<<(local_260,*local_418);
      std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
      std::ostream::put((char)plVar10);
      std::ostream::flush();
      pcVar3 = local_420;
      pcVar1 = (local_420->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                   ,0x3ac,(char *)local_3c8,(pcVar3->super_cmCTestGenericHandler).Quiet);
      goto LAB_0054f832;
    }
    break;
  case 4:
    if (local_418 != (int *)0x0) {
      iVar6 = cmsysProcess_GetExitValue(pcVar8);
      *local_418 = iVar6;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_260);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_260,"Command exited with the value: ",0x1f);
      plVar10 = (long *)std::ostream::operator<<(local_260,*local_418);
      std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
      std::ostream::put((char)plVar10);
      std::ostream::flush();
      pcVar3 = local_420;
      pcVar1 = (local_420->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                   ,0x37a,(char *)local_3c8,(pcVar3->super_cmCTestGenericHandler).Quiet);
      if (local_3c8 != (undefined1  [8])local_3b8) {
        operator_delete((void *)local_3c8,local_3b8._0_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_260);
      std::ios_base::~ios_base((ios_base *)local_1f0._M_local_buf);
      if (*local_418 != 0) {
        if (local_420->UseCTestLaunch == true) {
          cmsys::Directory::Directory((Directory *)local_3e8);
          cmsys::Directory::Load((Directory *)local_3e8,&local_420->CTestLaunchDir,(string *)0x0);
          uVar11 = cmsys::Directory::GetNumberOfFiles((Directory *)local_3e8);
          if (uVar11 == 0) {
LAB_0054f5e3:
            cmCTestLaunchReporter::cmCTestLaunchReporter((cmCTestLaunchReporter *)local_260);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator=(local_160,&local_2c8);
            cmCTestLaunchReporter::ComputeFileNames((cmCTestLaunchReporter *)local_260);
            local_118 = *local_418;
            local_120 = pcVar8;
            std::ostream::flush();
            local_3c8 = (undefined1  [8])local_3b8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"Build","");
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&(local_420->super_cmCTestGenericHandler).LogFileNames,
                         (key_type *)local_3c8);
            std::__cxx11::string::_M_assign(local_f0);
            if (local_3c8 != (undefined1  [8])local_3b8) {
              operator_delete((void *)local_3c8,local_3b8._0_8_ + 1);
            }
            std::__cxx11::string::append((char *)local_f0);
            cmCTestLaunchReporter::WriteXML((cmCTestLaunchReporter *)local_260);
            cmCTestLaunchReporter::~cmCTestLaunchReporter((cmCTestLaunchReporter *)local_260);
          }
          else {
            dindex = 0;
            do {
              pcVar13 = cmsys::Directory::GetFile((Directory *)local_3e8,dindex);
              local_260 = (undefined1  [8])strlen(pcVar13);
              local_258._M_p = pcVar13;
              if ((ulong)local_260 < (_func_int **)0x4) {
                bVar16 = false;
              }
              else {
                __str._M_str = ".xml";
                __str._M_len = 4;
                iVar6 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                  ((basic_string_view<char,_std::char_traits<char>_> *)local_260,
                                   (size_type)((long)local_260 - 4),4,__str);
                bVar16 = iVar6 == 0;
              }
              bVar2 = true;
            } while ((!bVar16) &&
                    (bVar16 = uVar11 - 1 != dindex, dindex = dindex + 1, bVar2 = false, bVar16));
            pcVar8 = local_410;
            if (!bVar2) goto LAB_0054f5e3;
          }
          cmsys::Directory::~Directory((Directory *)local_3e8);
        }
        else {
          local_258._M_p = local_250 + 8;
          local_250._0_8_ = 0;
          local_250._8_8_ = local_250._8_8_ & 0xffffffffffffff00;
          local_238._M_p = local_230 + 8;
          local_230._0_8_ = 0;
          local_230[8] = '\0';
          local_218._M_p = local_210 + 8;
          local_210._0_8_ = 0;
          local_210[8] = '\0';
          local_1f0._M_allocated_capacity = (size_type)&local_1e0;
          local_1f0._8_8_ = 0;
          local_1e0._M_local_buf[0] = '\0';
          local_1d0._M_allocated_capacity = (size_type)local_1c0;
          local_1d0._8_8_ = 0;
          local_1c0[0]._M_local_buf[0] = '\0';
          local_1f8 = 0;
          local_260._4_4_ = 1;
          pcVar13 = *local_2f8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          local_3b8._0_8_ = strlen(pcVar13);
          local_3c8 = (undefined1  [8])0x31;
          local_3c0._M_p = "*** WARNING non-zero return value in ctest from: ";
          views_00._M_len = 2;
          views_00._M_array = (iterator)local_3c8;
          local_3b8._8_8_ = pcVar13;
          cmCatViews_abi_cxx11_((string *)local_3e8,views_00);
          std::__cxx11::string::operator=((string *)&local_258,(string *)local_3e8);
          if ((DirectoryInternals *)local_3e8._0_8_ != (DirectoryInternals *)(local_3e8 + 0x10)) {
            operator_delete((void *)local_3e8._0_8_,local_3e8._16_8_ + 1);
          }
          local_1f0._8_8_ = 0;
          *(char *)local_1f0._M_allocated_capacity = '\0';
          local_1d0._8_8_ = 0;
          *(char *)local_1d0._M_allocated_capacity = '\0';
          local_260 = (undefined1  [8])((ulong)local_260 & 0xffffffffffffff00);
          std::
          vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
          ::emplace_back<cmCTestBuildHandler::cmCTestBuildErrorWarning>
                    (local_2d8,(cmCTestBuildErrorWarning *)local_260);
          local_420->TotalWarnings = local_420->TotalWarnings + 1;
          cmCTestBuildErrorWarning::~cmCTestBuildErrorWarning((cmCTestBuildErrorWarning *)local_260)
          ;
        }
      }
    }
    break;
  case 5:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_260);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_260,"There was a timeout",0x13);
    std::ios::widen((char)(ostream *)local_260 + (char)*(_func_int **)((long)local_260 + -0x18));
    std::ostream::put((char)local_260);
    std::ostream::flush();
    pcVar3 = local_420;
    pcVar1 = (local_420->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                 ,0x3b0,(char *)local_3c8,(pcVar3->super_cmCTestGenericHandler).Quiet);
LAB_0054f832:
    if (local_3c8 != (undefined1  [8])local_3b8) {
      operator_delete((void *)local_3c8,local_3b8._0_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_260);
    std::ios_base::~ios_base((ios_base *)local_1f0._M_local_buf);
  }
  cmsysProcess_Delete(pcVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,
                    CONCAT71(local_318.field_2._M_allocated_capacity._1_7_,
                             local_318.field_2._M_local_buf[0]) + 1);
  }
  LaunchHelper::~LaunchHelper(&local_270);
  if (local_2f8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (char **)0x0) {
    operator_delete(local_2f8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2f8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
LAB_0054fb6e:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2c8);
  return iVar5;
}

Assistant:

int cmCTestBuildHandler::RunMakeCommand(const std::string& command,
                                        int* retVal, const char* dir,
                                        int timeout, std::ostream& ofs,
                                        Encoding encoding)
{
  // First generate the command and arguments
  std::vector<std::string> args = cmSystemTools::ParseArguments(command);

  if (args.empty()) {
    return false;
  }

  std::vector<const char*> argv;
  argv.reserve(args.size() + 1);
  for (std::string const& arg : args) {
    argv.push_back(arg.c_str());
  }
  argv.push_back(nullptr);

  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Run command:", this->Quiet);
  for (char const* arg : argv) {
    if (!arg) {
      break;
    }
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       " \"" << arg << "\"", this->Quiet);
  }
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, std::endl,
                     this->Quiet);

  // Optionally use make rule launchers to record errors and warnings.
  LaunchHelper launchHelper(this);
  static_cast<void>(launchHelper);

  // Now create process object
  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, argv.data());
  cmsysProcess_SetWorkingDirectory(cp, dir);
  cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
  cmsysProcess_SetTimeout(cp, timeout);
  cmsysProcess_Execute(cp);

  // Initialize tick's
  std::string::size_type tick = 0;
  const std::string::size_type tick_len = 1024;

  char* data;
  int length;
  cmProcessOutput processOutput(encoding);
  std::string strdata;
  cmCTestOptionalLog(
    this->CTest, HANDLER_PROGRESS_OUTPUT,
    "   Each symbol represents "
      << tick_len << " bytes of output." << std::endl
      << (this->UseCTestLaunch
            ? ""
            : "   '!' represents an error and '*' a warning.\n")
      << "    " << std::flush,
    this->Quiet);

  // Initialize building structures
  this->BuildProcessingQueue.clear();
  this->OutputLineCounter = 0;
  this->ErrorsAndWarnings.clear();
  this->TotalErrors = 0;
  this->TotalWarnings = 0;
  this->BuildOutputLogSize = 0;
  this->LastTickChar = '.';
  this->WarningQuotaReached = false;
  this->ErrorQuotaReached = false;

  // For every chunk of data
  int res;
  while ((res = cmsysProcess_WaitForData(cp, &data, &length, nullptr))) {
    // Replace '\0' with '\n', since '\0' does not really make sense. This is
    // for Visual Studio output
    for (int cc = 0; cc < length; ++cc) {
      if (data[cc] == 0) {
        data[cc] = '\n';
      }
    }

    // Process the chunk of data
    if (res == cmsysProcess_Pipe_STDERR) {
      processOutput.DecodeText(data, length, strdata, 1);
      this->ProcessBuffer(strdata.c_str(), strdata.size(), tick, tick_len, ofs,
                          &this->BuildProcessingErrorQueue);
    } else {
      processOutput.DecodeText(data, length, strdata, 2);
      this->ProcessBuffer(strdata.c_str(), strdata.size(), tick, tick_len, ofs,
                          &this->BuildProcessingQueue);
    }
  }
  processOutput.DecodeText(std::string(), strdata, 1);
  if (!strdata.empty()) {
    this->ProcessBuffer(strdata.c_str(), strdata.size(), tick, tick_len, ofs,
                        &this->BuildProcessingErrorQueue);
  }
  processOutput.DecodeText(std::string(), strdata, 2);
  if (!strdata.empty()) {
    this->ProcessBuffer(strdata.c_str(), strdata.size(), tick, tick_len, ofs,
                        &this->BuildProcessingQueue);
  }

  this->ProcessBuffer(nullptr, 0, tick, tick_len, ofs,
                      &this->BuildProcessingQueue);
  this->ProcessBuffer(nullptr, 0, tick, tick_len, ofs,
                      &this->BuildProcessingErrorQueue);
  cmCTestOptionalLog(this->CTest, HANDLER_PROGRESS_OUTPUT,
                     " Size of output: "
                       << ((this->BuildOutputLogSize + 512) / 1024) << "K"
                       << std::endl,
                     this->Quiet);

  // Properly handle output of the build command
  cmsysProcess_WaitForExit(cp, nullptr);
  int result = cmsysProcess_GetState(cp);

  if (result == cmsysProcess_State_Exited) {
    if (retVal) {
      *retVal = cmsysProcess_GetExitValue(cp);
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "Command exited with the value: " << *retVal
                                                           << std::endl,
                         this->Quiet);
      // if a non zero return value
      if (*retVal) {
        // If there was an error running command, report that on the
        // dashboard.
        if (this->UseCTestLaunch) {
          // For launchers, do not record this top-level error if other
          // more granular build errors have already been captured.
          bool launcherXMLFound = false;
          cmsys::Directory launchDir;
          launchDir.Load(this->CTestLaunchDir);
          unsigned long n = launchDir.GetNumberOfFiles();
          for (unsigned long i = 0; i < n; ++i) {
            const char* fname = launchDir.GetFile(i);
            if (cmHasLiteralSuffix(fname, ".xml")) {
              launcherXMLFound = true;
              break;
            }
          }
          if (!launcherXMLFound) {
            cmCTestLaunchReporter reporter;
            reporter.RealArgs = args;
            reporter.ComputeFileNames();
            reporter.ExitCode = *retVal;
            reporter.Process = cp;
            // Use temporary BuildLog file to populate this error for CDash.
            ofs.flush();
            reporter.LogOut = this->LogFileNames["Build"];
            reporter.LogOut += ".tmp";
            reporter.WriteXML();
          }
        } else {
          cmCTestBuildErrorWarning errorwarning;
          errorwarning.LineNumber = 0;
          errorwarning.LogLine = 1;
          errorwarning.Text = cmStrCat(
            "*** WARNING non-zero return value in ctest from: ", argv[0]);
          errorwarning.PreContext.clear();
          errorwarning.PostContext.clear();
          errorwarning.Error = false;
          this->ErrorsAndWarnings.push_back(std::move(errorwarning));
          this->TotalWarnings++;
        }
      }
    }
  } else if (result == cmsysProcess_State_Exception) {
    if (retVal) {
      *retVal = cmsysProcess_GetExitException(cp);
      cmCTestOptionalLog(this->CTest, WARNING,
                         "There was an exception: " << *retVal << std::endl,
                         this->Quiet);
    }
  } else if (result == cmsysProcess_State_Expired) {
    cmCTestOptionalLog(this->CTest, WARNING,
                       "There was a timeout" << std::endl, this->Quiet);
  } else if (result == cmsysProcess_State_Error) {
    // If there was an error running command, report that on the dashboard.
    cmCTestBuildErrorWarning errorwarning;
    errorwarning.LineNumber = 0;
    errorwarning.LogLine = 1;
    errorwarning.Text =
      cmStrCat("*** ERROR executing: ", cmsysProcess_GetErrorString(cp));
    errorwarning.PreContext.clear();
    errorwarning.PostContext.clear();
    errorwarning.Error = true;
    this->ErrorsAndWarnings.push_back(std::move(errorwarning));
    this->TotalErrors++;
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "There was an error: " << cmsysProcess_GetErrorString(cp)
                                      << std::endl);
  }

  cmsysProcess_Delete(cp);
  return result;
}